

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinePaintScheme.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::MinePaintScheme::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MinePaintScheme *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  MinePaintScheme *local_18;
  MinePaintScheme *this_local;
  
  local_18 = this;
  this_local = (MinePaintScheme *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"MinePaintScheme:");
  poVar1 = std::operator<<(poVar1,"\n\tAlgae:           ");
  ENUMS::GetEnumAsStringMineAlgae_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((this->m_PntScmUnion).m_ui8PntSchm & 3),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tPaint Scheme:    ");
  ENUMS::GetEnumAsStringPaintScheme_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((this->m_PntScmUnion).m_ui8PntSchm >> 2),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString MinePaintScheme::GetAsString() const
{
    KStringStream ss;

    ss << "MinePaintScheme:"
       << "\n\tAlgae:           " << GetEnumAsStringMineAlgae( m_PntScmUnion.m_ui8Alg )
       << "\n\tPaint Scheme:    " << GetEnumAsStringPaintScheme( m_PntScmUnion.m_ui8Scm )
       << "\n";

    return ss.str();
}